

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learner.cc
# Opt level: O3

void LEARNER::generic_driver_onethread(vw *all)

{
  base_learner *pbVar1;
  multi_ex ctxt;
  multi_ex local_68;
  dispatch_fptr local_48;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  if (all->l[0xe8] == (base_learner)0x1) {
    local_68.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_28._8_8_ = 0;
    local_10 = std::
               _Function_handler<void_(vw_&,_v_array<example_*>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/learner.cc:224:26)>
               ::_M_invoke;
    local_18 = std::
               _Function_handler<void_(vw_&,_v_array<example_*>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/learner.cc:224:26)>
               ::_M_manager;
    local_28._M_unused._M_object = &local_68;
    parse_dispatch(all,(dispatch_fptr *)&local_28);
    if (local_18 != (code *)0x0) {
      (*local_18)(&local_28,&local_28,__destroy_functor);
    }
    if (local_68.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_68.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      dispatch_multi_ex<&LEARNER::process_multi_ex>(all,&local_68);
    }
    if (local_68.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  else {
    local_48.super__Function_base._M_functor._8_8_ = 0;
    local_48.super__Function_base._M_functor._M_unused._M_object = dispatch;
    local_48._M_invoker =
         std::
         _Function_handler<void_(vw_&,_v_array<example_*>_&),_void_(*)(vw_&,_v_array<example_*>)>::
         _M_invoke;
    local_48.super__Function_base._M_manager =
         std::
         _Function_handler<void_(vw_&,_v_array<example_*>_&),_void_(*)(vw_&,_v_array<example_*>)>::
         _M_manager;
    parse_dispatch(all,&local_48);
    if (local_48.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_48.super__Function_base._M_manager)
                ((_Any_data *)&local_48,(_Any_data *)&local_48,__destroy_functor);
    }
  }
  pbVar1 = all->l;
  do {
    (**(code **)(pbVar1 + 0xb0))(*(undefined8 *)(pbVar1 + 0xa0));
    pbVar1 = *(base_learner **)(pbVar1 + 0xa8);
  } while (pbVar1 != (base_learner *)0x0);
  return;
}

Assistant:

void generic_driver_onethread(vw& all)
{
  if (all.l->is_multiline)
  {
    multi_ex ctxt;
    auto multi_ex_fptr = [&ctxt](vw& all, v_array<example*> examples) {
      all.p->end_parsed_examples += examples.size();  // divergence: lock & signal
      for (size_t i = 0; i < examples.size(); ++i) on_new_partial_ex<process_multi_ex>(examples[i], ctxt, all);
    };

    parse_dispatch(all, multi_ex_fptr);

    // flush accumulated examples if there is no newline
    // at the end of the file
    on_new_partial_ex<process_multi_ex>(nullptr, ctxt, all);
  }
  else
    parse_dispatch(all, dispatch);

  all.l->end_examples();
}